

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::api::anon_unknown_1::ImageView::create
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  VkImageViewCreateInfo imageViewInfo;
  VkImageViewCreateInfo local_58;
  
  local_58.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58.image.m_internal =
       (res->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_58.viewType = params->viewType;
  local_58.format = params->format;
  local_58.components.r = (params->components).r;
  local_58.components.g = (params->components).g;
  local_58.components.b = (params->components).b;
  local_58.components.a = (params->components).a;
  local_58.subresourceRange.aspectMask = (params->subresourceRange).aspectMask;
  local_58.subresourceRange.baseMipLevel = (params->subresourceRange).baseMipLevel;
  local_58.subresourceRange.levelCount = (params->subresourceRange).levelCount;
  local_58.subresourceRange.baseArrayLayer = (params->subresourceRange).baseArrayLayer;
  local_58.subresourceRange.layerCount = (params->subresourceRange).layerCount;
  ::vk::createImageView
            (__return_storage_ptr__,env->vkd,env->device,&local_58,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkImageView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkImageViewCreateInfo	imageViewInfo	=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
			DE_NULL,
			(VkImageViewCreateFlags)0,
			*res.image.object,
			params.viewType,
			params.format,
			params.components,
			params.subresourceRange,
		};

		return createImageView(env.vkd, env.device, &imageViewInfo, env.allocationCallbacks);
	}